

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O0

void CountLevels(SmoothParams *p)

{
  uint uVar1;
  int *in_RDI;
  int level_dist;
  int v;
  uint8_t *data;
  uint8_t used_levels [256];
  int last_level;
  int j;
  int i;
  long local_120;
  char local_118 [260];
  int local_14;
  int local_10;
  int local_c;
  int *local_8;
  
  local_8 = in_RDI;
  memset(local_118,0,0x100);
  local_120 = *(long *)(local_8 + 4);
  local_8[0x17] = 0xff;
  local_8[0x18] = 0;
  for (local_10 = 0; local_10 < local_8[1]; local_10 = local_10 + 1) {
    for (local_c = 0; local_c < *local_8; local_c = local_c + 1) {
      uVar1 = (uint)*(byte *)(local_120 + local_c);
      if ((int)uVar1 < local_8[0x17]) {
        local_8[0x17] = uVar1;
      }
      if (local_8[0x18] < (int)uVar1) {
        local_8[0x18] = uVar1;
      }
      local_118[(int)uVar1] = '\x01';
    }
    local_120 = local_120 + local_8[2];
  }
  local_8[0x19] = local_8[0x18] - local_8[0x17];
  local_14 = -1;
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    if (local_118[local_c] != '\0') {
      local_8[0x16] = local_8[0x16] + 1;
      if ((-1 < local_14) && (local_c - local_14 < local_8[0x19])) {
        local_8[0x19] = local_c - local_14;
      }
      local_14 = local_c;
    }
  }
  return;
}

Assistant:

static void CountLevels(SmoothParams* const p) {
  int i, j, last_level;
  uint8_t used_levels[256] = { 0 };
  const uint8_t* data = p->src_;
  p->min_ = 255;
  p->max_ = 0;
  for (j = 0; j < p->height_; ++j) {
    for (i = 0; i < p->width_; ++i) {
      const int v = data[i];
      if (v < p->min_) p->min_ = v;
      if (v > p->max_) p->max_ = v;
      used_levels[v] = 1;
    }
    data += p->stride_;
  }
  // Compute the mininum distance between two non-zero levels.
  p->min_level_dist_ = p->max_ - p->min_;
  last_level = -1;
  for (i = 0; i < 256; ++i) {
    if (used_levels[i]) {
      ++p->num_levels_;
      if (last_level >= 0) {
        const int level_dist = i - last_level;
        if (level_dist < p->min_level_dist_) {
          p->min_level_dist_ = level_dist;
        }
      }
      last_level = i;
    }
  }
}